

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionSettings.cpp
# Opt level: O1

set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> * __thiscall
FIX::SessionSettings::getSessions
          (set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
           *__return_storage_ptr__,SessionSettings *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *p_Var2;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  for (p_Var2 = (this->m_settings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_settings)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    std::
    _Rb_tree<FIX::SessionID,FIX::SessionID,std::_Identity<FIX::SessionID>,std::less<FIX::SessionID>,std::allocator<FIX::SessionID>>
    ::_M_insert_unique<FIX::SessionID_const&>
              ((_Rb_tree<FIX::SessionID,FIX::SessionID,std::_Identity<FIX::SessionID>,std::less<FIX::SessionID>,std::allocator<FIX::SessionID>>
                *)__return_storage_ptr__,(SessionID *)(p_Var2 + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<SessionID> SessionSettings::getSessions() const {
  std::set<SessionID> result;
  for (const Dictionaries::value_type &setting : m_settings) {
    result.insert(setting.first);
  }
  return result;
}